

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

bool slang::ast::actuallyNeededCast(Type *type,Expression *operand)

{
  bool bVar1;
  MinTypMaxExpression *this;
  ConditionalExpression *this_00;
  Type *in_RSI;
  Type *unaff_retaddr;
  Type *in_stack_00000008;
  ConditionalExpression *cond;
  Type *in_stack_ffffffffffffffa8;
  bool local_41;
  Expression *in_stack_ffffffffffffffe0;
  bool local_1;
  
  switch((in_RSI->super_Symbol).kind) {
  case PackedArrayType:
    this_00 = Expression::as<slang::ast::ConditionalExpression>((Expression *)in_RSI);
    ConditionalExpression::left(this_00);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xb88a9b);
    bVar1 = Type::isEquivalent(in_stack_00000008,unaff_retaddr);
    if (bVar1) {
      ConditionalExpression::right(this_00);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xb88ace);
      bVar1 = Type::isEquivalent(in_stack_00000008,unaff_retaddr);
      if (bVar1) {
        ConditionalExpression::left(this_00);
        bVar1 = actuallyNeededCast(in_RSI,&this_00->super_Expression);
        local_41 = true;
        if (!bVar1) {
          ConditionalExpression::right(this_00);
          local_41 = actuallyNeededCast(in_RSI,&this_00->super_Expression);
        }
        return local_41;
      }
    }
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case DPIOpenArrayType:
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb88a25);
    local_1 = Type::isUnpackedArray(in_stack_ffffffffffffffa8);
    break;
  case StringType:
  case EventType:
  case UnboundedType:
  case PropertyType:
  case VirtualInterfaceType:
  case TypeAlias:
  case TypeParameter:
    local_1 = true;
    break;
  case ForwardingTypedef:
    this = Expression::as<slang::ast::MinTypMaxExpression>((Expression *)in_RSI);
    MinTypMaxExpression::selected(this);
    local_1 = actuallyNeededCast(in_RSI,in_stack_ffffffffffffffe0);
  }
  return local_1;
}

Assistant:

static bool actuallyNeededCast(const Type& type, const Expression& operand) {
    // Check whether a cast was needed for the given operand to
    // reach the final type. This is true when the operand requires
    // an assignment-like context to determine its result.
    switch (operand.kind) {
        case ExpressionKind::NewArray:
        case ExpressionKind::NewClass:
        case ExpressionKind::NewCovergroup:
        case ExpressionKind::SimpleAssignmentPattern:
        case ExpressionKind::StructuredAssignmentPattern:
        case ExpressionKind::ReplicatedAssignmentPattern:
        case ExpressionKind::TaggedUnion:
            return true;
        case ExpressionKind::Concatenation:
            return operand.type->isUnpackedArray();
        case ExpressionKind::MinTypMax:
            return actuallyNeededCast(type, operand.as<MinTypMaxExpression>().selected());
        case ExpressionKind::ConditionalOp: {
            auto& cond = operand.as<ConditionalExpression>();
            if (!type.isEquivalent(*cond.left().type) || !type.isEquivalent(*cond.right().type))
                return true;
            return actuallyNeededCast(type, cond.left()) || actuallyNeededCast(type, cond.right());
        }
        default:
            return false;
    }
}